

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O3

void __thiscall
cxxopts::OptionValue::parse
          (OptionValue *this,shared_ptr<const_cxxopts::OptionDetails> *details,string *text)

{
  element_type *peVar1;
  shared_ptr<const_cxxopts::OptionDetails> local_20;
  
  local_20.super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (details->super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr;
  local_20.super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (details->super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>).
          _M_refcount._M_pi;
  if (local_20.super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_20.super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_20.super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_20.super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_20.super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  ensure_value(this,&local_20);
  if (local_20.super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  this->m_count = this->m_count + 1;
  peVar1 = (this->m_value).super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar1->_vptr_Value[3])(peVar1,text);
  return;
}

Assistant:

void
    parse
    (
      std::shared_ptr<const OptionDetails> details,
      const std::string& text
    )
    {
      ensure_value(details);
      ++m_count;
      m_value->parse(text);
    }